

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_compile.c
# Opt level: O1

BOOL get_ucp(PCRE2_SPTR8 *ptrptr,BOOL *negptr,uint *ptypeptr,uint *pdataptr,int *errorcodeptr,
            compile_block_8 *cb)

{
  byte bVar1;
  PCRE2_SPTR8 pPVar2;
  int iVar3;
  PCRE2_SPTR8 pPVar4;
  byte *pbVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  byte local_68 [32];
  uint *local_48;
  uint *local_40;
  int *local_38;
  
  pPVar2 = *ptrptr;
  *negptr = 0;
  pPVar4 = pPVar2 + 1;
  bVar1 = pPVar2[1];
  if ((ulong)bVar1 == 0x7b) {
    if (pPVar2[2] == '^') {
      pPVar4 = pPVar2 + 2;
      *negptr = 1;
    }
    uVar8 = 0;
    do {
      uVar7 = uVar8;
      bVar1 = pPVar4[uVar7 + 1];
      if (bVar1 == 0) {
        pPVar4 = pPVar4 + uVar7 + 1;
        goto LAB_0011090a;
      }
      uVar8 = uVar7;
      if (bVar1 == 0x7d) goto LAB_00110860;
      local_68[uVar7] = bVar1;
      uVar8 = uVar7 + 1;
    } while (uVar7 + 1 != 0x1f);
    uVar8 = 0x1f;
LAB_00110860:
    pPVar4 = pPVar4 + uVar7 + 1;
    if (bVar1 != 0x7d) {
LAB_0011090a:
      *errorcodeptr = 0x92;
      *ptrptr = pPVar4;
      return 0;
    }
    pbVar5 = local_68 + (uVar8 & 0xffffffff);
  }
  else {
    if ((cb->ctypes[bVar1] & 2) == 0) goto LAB_0011090a;
    pbVar5 = local_68 + 1;
    local_68[0] = bVar1;
  }
  local_48 = pdataptr;
  local_40 = ptypeptr;
  local_38 = errorcodeptr;
  *pbVar5 = 0;
  *ptrptr = pPVar4;
  uVar6 = 0xa9;
  iVar10 = 0;
  do {
    if ((int)uVar6 <= iVar10) {
      *local_38 = 0x93;
      return 0;
    }
    uVar9 = uVar6 + iVar10 >> 1;
    iVar3 = _pcre2_strcmp_c8_8(local_68,"Any" + _pcre2_utt_8[uVar9].name_offset);
    if (iVar3 == 0) {
      *local_40 = (uint)_pcre2_utt_8[uVar9].type;
      *local_48 = (uint)_pcre2_utt_8[uVar9].value;
      uVar9 = uVar6;
    }
    else if (0 < iVar3) {
      iVar10 = uVar9 + 1;
      uVar9 = uVar6;
    }
    uVar6 = uVar9;
  } while (iVar3 != 0);
  return 1;
}

Assistant:

static BOOL
get_ucp(PCRE2_SPTR *ptrptr, BOOL *negptr, unsigned int *ptypeptr,
  unsigned int *pdataptr, int *errorcodeptr, compile_block *cb)
{
register PCRE2_UCHAR c;
int i, bot, top;
PCRE2_SPTR ptr = *ptrptr;
PCRE2_UCHAR name[32];

*negptr = FALSE;
c = *(++ptr);

/* \P or \p can be followed by a name in {}, optionally preceded by ^ for
negation. */

if (c == CHAR_LEFT_CURLY_BRACKET)
  {
  if (ptr[1] == CHAR_CIRCUMFLEX_ACCENT)
    {
    *negptr = TRUE;
    ptr++;
    }
  for (i = 0; i < (int)(sizeof(name) / sizeof(PCRE2_UCHAR)) - 1; i++)
    {
    c = *(++ptr);
    if (c == CHAR_NULL) goto ERROR_RETURN;
    if (c == CHAR_RIGHT_CURLY_BRACKET) break;
    name[i] = c;
    }
  if (c != CHAR_RIGHT_CURLY_BRACKET) goto ERROR_RETURN;
  name[i] = 0;
  }

/* Otherwise there is just one following character, which must be an ASCII
letter. */

else if (MAX_255(c) && (cb->ctypes[c] & ctype_letter) != 0)
  {
  name[0] = c;
  name[1] = 0;
  }
else goto ERROR_RETURN;

*ptrptr = ptr;

/* Search for a recognized property name using binary chop. */

bot = 0;
top = PRIV(utt_size);

while (bot < top)
  {
  int r;
  i = (bot + top) >> 1;
  r = PRIV(strcmp_c8)(name, PRIV(utt_names) + PRIV(utt)[i].name_offset);
  if (r == 0)
    {
    *ptypeptr = PRIV(utt)[i].type;
    *pdataptr = PRIV(utt)[i].value;
    return TRUE;
    }
  if (r > 0) bot = i + 1; else top = i;
  }
*errorcodeptr = ERR47;   /* Unrecognized name */
return FALSE;

ERROR_RETURN:            /* Malformed \P or \p */
*errorcodeptr = ERR46;
*ptrptr = ptr;
return FALSE;
}